

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void tcmalloc::Coalesce(AllocList *a)

{
  AllocList *head;
  AllocList *e;
  long lVar1;
  Arena *pAVar2;
  int iVar3;
  AllocList *local_118;
  AllocList *prev [30];
  
  e = a->next[0];
  if ((e != (AllocList *)0x0) &&
     (lVar1 = (a->header).size, (AllocList *)((long)a->next + lVar1 + -0x28) == e)) {
    pAVar2 = (a->header).arena;
    (a->header).size = lVar1 + (e->header).size;
    (e->header).magic = 0;
    (e->header).arena = (Arena *)0x0;
    head = &pAVar2->freelist;
    LLA_SkiplistDelete(head,e,&local_118);
    LLA_SkiplistDelete(head,a,&local_118);
    iVar3 = LLA_SkiplistLevels((a->header).size,pAVar2->min_size,true);
    a->levels = iVar3;
    LLA_SkiplistInsert(head,a,&local_118);
  }
  return;
}

Assistant:

static void Coalesce(AllocList *a) {
  AllocList *n = a->next[0];
  if (n != 0 && reinterpret_cast<char *>(a) + a->header.size ==
                    reinterpret_cast<char *>(n)) {
    LowLevelAlloc::Arena *arena = a->header.arena;
    a->header.size += n->header.size;
    n->header.magic = 0;
    n->header.arena = 0;
    AllocList *prev[kMaxLevel];
    LLA_SkiplistDelete(&arena->freelist, n, prev);
    LLA_SkiplistDelete(&arena->freelist, a, prev);
    a->levels = LLA_SkiplistLevels(a->header.size, arena->min_size, true);
    LLA_SkiplistInsert(&arena->freelist, a, prev);
  }
}